

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O2

bool absl::debugging_internal::DemangleRustSymbolEncoding(char *mangled,char *out,size_t out_size)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  ReturnAddress RVar6;
  int iVar7;
  ulong uVar8;
  char cVar9;
  char *pcVar10;
  int iVar11;
  RustSymbolParser local_1e8;
  int local_34;
  
  memset(&local_1e8,0,400);
  if (out_size != 0) {
    *out = '\0';
  }
  if (*mangled == '_') {
    iVar11 = 0;
    bVar3 = 0;
    if (mangled[1] == 'R') {
      local_1e8.recursion_depth_ = 1;
      local_1e8.recursion_stack_[0] = kInstantiatingCrate;
      local_1e8.encoding_ = mangled;
      local_1e8.out_ = out;
      local_1e8.out_end_ = out + out_size;
      iVar7 = 2;
LAB_002d27dd:
      lVar5 = (long)iVar7 + 1;
      local_1e8.pos_ = (int)lVar5;
      cVar9 = local_1e8.encoding_[iVar7];
      if (cVar9 == 'B') {
        bVar2 = anon_unknown_0::RustSymbolParser::BeginBackref(&local_1e8);
        if (!bVar2) goto LAB_002d3599;
        if (local_1e8.silence_depth_ != 0) goto switchD_002d2e70_caseD_1c;
        lVar5 = (long)local_1e8.recursion_depth_;
        if (lVar5 == 0x100) goto LAB_002d3599;
        local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
        local_1e8.recursion_stack_[lVar5] = kPathBackrefEnding;
      }
      else {
        if (cVar9 == 'Y') {
          bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"<");
          if ((bVar2) && (lVar5 = (long)local_1e8.recursion_depth_, lVar5 != 0x100)) {
            local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
            local_1e8.recursion_stack_[lVar5] = kTraitDefinitionInfix;
            goto LAB_002d29bc;
          }
          goto LAB_002d3599;
        }
        if (cVar9 == 'I') {
          lVar5 = (long)local_1e8.recursion_depth_;
          if (lVar5 == 0x100) goto LAB_002d3599;
          local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
          local_1e8.recursion_stack_[lVar5] = kBeginGenericArgList;
        }
        else {
          if (cVar9 == 'M') {
            bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"<");
            bVar3 = 0;
            if (!bVar2) goto LAB_002d359c;
            RVar6 = kInherentImplType;
          }
          else {
            if (cVar9 == 'N') {
              local_1e8.pos_ = iVar7 + 2;
              if ((byte)(local_1e8.encoding_[lVar5] + 0xbfU) < 0x1a) {
                lVar4 = (long)local_1e8.namespace_depth_;
                if (lVar4 != 0x40) {
                  local_1e8.namespace_depth_ = local_1e8.namespace_depth_ + 1;
                  local_1e8.namespace_stack_[lVar4] = local_1e8.encoding_[lVar5];
                  lVar5 = (long)local_1e8.recursion_depth_;
                  if (lVar5 != 0x100) {
                    local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                    local_1e8.recursion_stack_[lVar5] = kIdentifierInUppercaseNamespace;
                    goto switchD_002d29f0_caseD_43;
                  }
                }
                goto LAB_002d3599;
              }
              if ((0x19 < (byte)(local_1e8.encoding_[lVar5] + 0x9fU)) ||
                 (lVar5 = (long)local_1e8.recursion_depth_, lVar5 == 0x100)) goto LAB_002d3599;
              local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
              local_1e8.recursion_stack_[lVar5] = kIdentifierInLowercaseNamespace;
              goto switchD_002d29f0_caseD_43;
            }
            if (cVar9 != 'X') {
              if (cVar9 == 'C') {
LAB_002d282e:
                bVar3 = 0;
                bVar2 = anon_unknown_0::RustSymbolParser::ParseIdentifier(&local_1e8,'\0');
                if (bVar2) {
switchD_002d2e70_default:
                  iVar7 = local_1e8.recursion_depth_;
                  if ((0x1fffe < iVar11) || (local_1e8.recursion_depth_ < 1)) goto LAB_002d3599;
                  iVar11 = iVar11 + 1;
                  uVar1 = local_1e8.recursion_depth_ - 1;
                  local_1e8.recursion_depth_ = uVar1;
                  switch(local_1e8.recursion_stack_[uVar1]) {
                  case kInstantiatingCrate:
                    if (0x19 < (byte)((local_1e8.encoding_[local_1e8.pos_] & 0xdfU) + 0xbf))
                    goto LAB_002d3579;
                    local_1e8.silence_depth_ = local_1e8.silence_depth_ + 1;
                    if (uVar1 == 0x100) goto LAB_002d3599;
                    local_1e8.recursion_depth_ = iVar7;
                    local_1e8.recursion_stack_[uVar1] = kVendorSpecificSuffix;
                    goto switchD_002d29f0_caseD_43;
                  case kVendorSpecificSuffix:
LAB_002d3579:
                    if (0x2e < (byte)local_1e8.encoding_[local_1e8.pos_]) goto LAB_002d3599;
                    bVar3 = (byte)(0x401000000001 >> (local_1e8.encoding_[local_1e8.pos_] & 0x3fU));
                    goto LAB_002d359c;
                  case kIdentifierInUppercaseNamespace:
                    bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"::");
                    if (bVar2) {
                      lVar5 = (long)local_1e8.namespace_depth_;
                      local_1e8.namespace_depth_ = local_1e8.namespace_depth_ + -1;
                      bVar2 = anon_unknown_0::RustSymbolParser::ParseIdentifier
                                        (&local_1e8,local_1e8.namespace_stack_[lVar5 + -1]);
                      goto LAB_002d322d;
                    }
                    goto LAB_002d3599;
                  case kIdentifierInLowercaseNamespace:
                    goto switchD_002d2e70_caseD_3;
                  case kInherentImplType:
                    if (uVar1 != 0x100) {
                      local_1e8.recursion_depth_ = iVar7;
                      local_1e8.recursion_stack_[uVar1] = kInherentImplEnding;
                      goto LAB_002d29bc;
                    }
                    goto LAB_002d3599;
                  case kInherentImplEnding:
                  case kTraitImplEnding:
                  case kTraitDefinitionEnding:
                    pcVar10 = ">";
                    break;
                  case kTraitImplType:
                    if (uVar1 != 0x100) {
                      local_1e8.recursion_depth_ = iVar7;
                      local_1e8.recursion_stack_[uVar1] = kTraitImplInfix;
                      goto LAB_002d29bc;
                    }
                    goto LAB_002d3599;
                  case kTraitImplInfix:
                    bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8," as ");
                    if ((!bVar2) || (lVar5 = (long)local_1e8.recursion_depth_, lVar5 == 0x100))
                    goto LAB_002d3599;
                    local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                    local_1e8.recursion_stack_[lVar5] = kTraitImplEnding;
                    goto switchD_002d29f0_caseD_43;
                  case kImplPathEnding:
                  case kFinishFn:
                    goto switchD_002d2e70_caseD_9;
                  case kTraitDefinitionInfix:
                    bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8," as ");
                    if ((!bVar2) || (lVar5 = (long)local_1e8.recursion_depth_, lVar5 == 0x100))
                    goto LAB_002d3599;
                    local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                    local_1e8.recursion_stack_[lVar5] = kTraitDefinitionEnding;
                    goto switchD_002d29f0_caseD_43;
                  case kArraySize:
                    bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"; ");
                    if ((bVar2) && (lVar5 = (long)local_1e8.recursion_depth_, lVar5 != 0x100)) {
                      local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                      local_1e8.recursion_stack_[lVar5] = kFinishArray;
                      goto LAB_002d3291;
                    }
                    goto LAB_002d3599;
                  case kFinishArray:
                  case kSliceEnding:
                    pcVar10 = "]";
                    break;
                  case kAfterFirstTupleElement:
                    if (local_1e8.encoding_[local_1e8.pos_] != 'E') {
                      bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,", ");
                      if ((bVar2) && (lVar5 = (long)local_1e8.recursion_depth_, lVar5 != 0x100)) {
                        local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                        local_1e8.recursion_stack_[lVar5] = kAfterSecondTupleElement;
                        goto LAB_002d29bc;
                      }
                      goto LAB_002d3599;
                    }
                    local_1e8.pos_ = local_1e8.pos_ + 1;
                    pcVar10 = ",)";
                    break;
                  case kAfterSecondTupleElement:
                    if (local_1e8.encoding_[local_1e8.pos_] == 'E') goto LAB_002d3221;
                    bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,", ");
                    if ((bVar2) && (lVar5 = (long)local_1e8.recursion_depth_, lVar5 != 0x100)) {
                      local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                      local_1e8.recursion_stack_[lVar5] = kAfterThirdTupleElement;
                      goto LAB_002d29bc;
                    }
                    goto LAB_002d3599;
                  case kAfterThirdTupleElement:
                    if (local_1e8.encoding_[local_1e8.pos_] != 'E') {
                      bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,", ...)");
                      if (bVar2) {
                        local_1e8.silence_depth_ = local_1e8.silence_depth_ + 1;
                        goto switchD_002d2e70_caseD_12;
                      }
                      goto LAB_002d3599;
                    }
LAB_002d3221:
                    local_1e8.pos_ = local_1e8.pos_ + 1;
                    pcVar10 = ")";
                    break;
                  case kAfterSubsequentTupleElement:
switchD_002d2e70_caseD_12:
                    if (local_1e8.encoding_[local_1e8.pos_] == 'E') goto LAB_002d30ee;
                    lVar5 = (long)local_1e8.recursion_depth_;
                    if (lVar5 != 0x100) {
                      local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                      local_1e8.recursion_stack_[lVar5] = kAfterSubsequentTupleElement;
                      goto LAB_002d29bc;
                    }
                    goto LAB_002d3599;
                  case kContinueParameterList:
                    goto switchD_002d2e70_caseD_13;
                  case kBeginAutoTraits:
                  case kContinueAutoTraits:
                    if (local_1e8.encoding_[local_1e8.pos_] == 'E') {
LAB_002d2ca5:
                      lVar5 = (long)local_1e8.pos_;
                      local_1e8.pos_ = local_1e8.pos_ + 1;
                      if (local_1e8.encoding_[lVar5 + 1] == 'L') goto LAB_002d3281;
                      goto LAB_002d3599;
                    }
                    bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8," + ");
                    bVar3 = 0;
                    if ((!bVar2) ||
                       (RVar6 = kContinueAutoTraits, local_1e8.recursion_depth_ == 0x100))
                    goto LAB_002d359c;
LAB_002d2d75:
                    lVar5 = (long)local_1e8.recursion_depth_;
                    local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                    local_1e8.recursion_stack_[lVar5] = RVar6;
                    lVar5 = (long)local_1e8.recursion_depth_;
                    if (lVar5 == 0x100) goto LAB_002d3599;
                    local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                    local_1e8.recursion_stack_[lVar5] = kContinueDynTrait;
                    goto switchD_002d29f0_caseD_43;
                  case kContinueDynTrait:
                    if (local_1e8.encoding_[local_1e8.pos_] == 'p') {
                      bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"<>");
                      if (bVar2) {
                        local_1e8.silence_depth_ = local_1e8.silence_depth_ + 1;
                        goto switchD_002d2e70_caseD_18;
                      }
                      goto LAB_002d3599;
                    }
                    goto switchD_002d2e70_default;
                  case kContinueAssocBinding:
switchD_002d2e70_caseD_18:
                    if (local_1e8.encoding_[local_1e8.pos_] == 'p') {
                      local_1e8.pos_ = local_1e8.pos_ + 1;
                      bVar3 = 0;
                      bVar2 = anon_unknown_0::RustSymbolParser::ParseUndisambiguatedIdentifier
                                        (&local_1e8,'\0',0);
                      if (bVar2) {
                        lVar5 = (long)local_1e8.recursion_depth_;
                        if (lVar5 != 0x100) {
                          local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                          local_1e8.recursion_stack_[lVar5] = kContinueAssocBinding;
LAB_002d29bc:
                          lVar5 = (long)local_1e8.pos_;
                          if ((byte)(local_1e8.encoding_[lVar5] + 0x9fU) < 0x1a) goto LAB_002d2b71;
                          switch(local_1e8.encoding_[lVar5]) {
                          case 'A':
                            local_1e8.pos_ = local_1e8.pos_ + 1;
                            bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"[");
                            bVar3 = 0;
                            if (!bVar2) goto LAB_002d359c;
                            RVar6 = kArraySize;
                            break;
                          case 'B':
                            local_1e8.pos_ = local_1e8.pos_ + 1;
                            bVar2 = anon_unknown_0::RustSymbolParser::BeginBackref(&local_1e8);
                            if (bVar2) {
                              if (local_1e8.silence_depth_ == 0) {
                                RVar6 = kTypeBackrefEnding;
                                goto LAB_002d2b52;
                              }
                              goto switchD_002d2e70_caseD_1c;
                            }
                            goto LAB_002d3599;
                          default:
                            goto switchD_002d29f0_caseD_43;
                          case 'D':
                            local_1e8.pos_ = local_1e8.pos_ + 1;
                            bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"dyn ");
                            if ((!bVar2) ||
                               (bVar2 = anon_unknown_0::RustSymbolParser::ParseOptionalBinder
                                                  (&local_1e8), !bVar2)) goto LAB_002d3599;
                            if (local_1e8.encoding_[local_1e8.pos_] == 'E') goto LAB_002d2ca5;
                            RVar6 = kBeginAutoTraits;
                            if (local_1e8.recursion_depth_ != 0x100) goto LAB_002d2d75;
                            goto LAB_002d3599;
                          case 'F':
                            local_1e8.pos_ = local_1e8.pos_ + 1;
                            bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"fn...");
                            if (!bVar2) goto LAB_002d3599;
                            local_1e8.silence_depth_ = local_1e8.silence_depth_ + 1;
                            bVar2 = anon_unknown_0::RustSymbolParser::ParseOptionalBinder
                                              (&local_1e8);
                            if (!bVar2) goto LAB_002d3599;
                            lVar5 = (long)local_1e8.pos_;
                            cVar9 = local_1e8.encoding_[lVar5];
                            if (cVar9 == 'U') {
                              local_1e8.pos_ = local_1e8.pos_ + 1;
                              cVar9 = local_1e8.encoding_[lVar5 + 1];
                            }
                            if (cVar9 == 'K') {
                              if (local_1e8.encoding_[(long)local_1e8.pos_ + 1] == 'C') {
                                local_1e8.pos_ = local_1e8.pos_ + 2;
                              }
                              else {
                                bVar3 = 0;
                                local_1e8.pos_ = local_1e8.pos_ + 1;
                                bVar2 = anon_unknown_0::RustSymbolParser::
                                        ParseUndisambiguatedIdentifier(&local_1e8,'\0',0);
                                if (!bVar2) goto LAB_002d359c;
                              }
                            }
switchD_002d2e70_caseD_13:
                            if (local_1e8.encoding_[local_1e8.pos_] == 'E') {
                              local_1e8.pos_ = local_1e8.pos_ + 1;
                              lVar5 = (long)local_1e8.recursion_depth_;
                              if (lVar5 == 0x100) goto LAB_002d3599;
                              local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                              local_1e8.recursion_stack_[lVar5] = kFinishFn;
                            }
                            else {
                              lVar5 = (long)local_1e8.recursion_depth_;
                              if (lVar5 == 0x100) goto LAB_002d3599;
                              local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                              local_1e8.recursion_stack_[lVar5] = kContinueParameterList;
                            }
                            goto LAB_002d29bc;
                          case 'O':
                            pcVar10 = "*mut ";
                            goto LAB_002d2ac2;
                          case 'P':
                            pcVar10 = "*const ";
LAB_002d2ac2:
                            local_1e8.pos_ = local_1e8.pos_ + 1;
                            bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,pcVar10);
LAB_002d2ac7:
                            bVar3 = 0;
                            if (bVar2 == false) goto LAB_002d359c;
                            goto LAB_002d29bc;
                          case 'Q':
                            pcVar10 = "&mut ";
                            goto LAB_002d2a63;
                          case 'R':
                            pcVar10 = "&";
LAB_002d2a63:
                            local_1e8.pos_ = local_1e8.pos_ + 1;
                            bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,pcVar10);
                            if (bVar2) {
                              bVar2 = anon_unknown_0::RustSymbolParser::ParseOptionalLifetime
                                                (&local_1e8);
                              goto LAB_002d2ac7;
                            }
                            goto LAB_002d3599;
                          case 'S':
                            local_1e8.pos_ = local_1e8.pos_ + 1;
                            bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"[");
                            bVar3 = 0;
                            if (!bVar2) goto LAB_002d359c;
                            RVar6 = kSliceEnding;
                            break;
                          case 'T':
                            local_1e8.pos_ = local_1e8.pos_ + 1;
                            bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"(");
                            if (bVar2) {
                              if (local_1e8.encoding_[local_1e8.pos_] != 'E') {
                                RVar6 = kAfterFirstTupleElement;
LAB_002d2b52:
                                if (local_1e8.recursion_depth_ != 0x100) goto LAB_002d2b5d;
                                goto LAB_002d3599;
                              }
                              goto LAB_002d3221;
                            }
                            goto LAB_002d3599;
                          }
                          bVar3 = 0;
                          if (local_1e8.recursion_depth_ == 0x100) goto LAB_002d359c;
LAB_002d2b5d:
                          lVar5 = (long)local_1e8.recursion_depth_;
                          local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                          local_1e8.recursion_stack_[lVar5] = RVar6;
                          goto LAB_002d29bc;
                        }
                        goto LAB_002d3599;
                      }
                      goto LAB_002d359c;
                    }
switchD_002d2e70_caseD_9:
                    local_1e8.silence_depth_ = local_1e8.silence_depth_ + -1;
                    goto switchD_002d2e70_default;
                  case kConstData:
                    if ((local_1e8.encoding_[local_1e8.pos_] == 'n') &&
                       (local_1e8.pos_ = local_1e8.pos_ + 1, local_1e8.silence_depth_ < 2)) {
                      if ((long)local_1e8.out_end_ - (long)local_1e8.out_ < 2) goto LAB_002d3599;
                      *local_1e8.out_ = '-';
                      local_1e8.out_[1] = '\0';
                      local_1e8.out_ = local_1e8.out_ + 1;
                    }
                    local_1e8.silence_depth_ = local_1e8.silence_depth_ + -1;
                    bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"0x");
                    pcVar10 = local_1e8.out_;
                    if (!bVar2) goto LAB_002d3599;
                    uVar8 = (ulong)local_1e8.pos_;
                    cVar9 = local_1e8.encoding_[uVar8];
                    if (cVar9 == '0') {
                      if (local_1e8.silence_depth_ < 1) {
                        if ((long)local_1e8.out_end_ - (long)local_1e8.out_ < 2) goto LAB_002d3599;
                        local_1e8.out_ = local_1e8.out_ + 1;
                        *pcVar10 = '0';
                        *local_1e8.out_ = '\0';
                      }
                      if (local_1e8.encoding_[local_1e8.pos_ + 1] != '_') goto LAB_002d3599;
                      local_1e8.pos_ = local_1e8.pos_ + 2;
                    }
                    else {
                      while (pcVar10 = local_1e8.out_, iVar7 = (int)uVar8,
                            (byte)(cVar9 - 0x30U) < 10 || (byte)(cVar9 + 0x9fU) < 6) {
                        if (local_1e8.silence_depth_ < 1) {
                          if ((long)local_1e8.out_end_ - (long)local_1e8.out_ < 2)
                          goto LAB_002d3599;
                          local_1e8.out_ = local_1e8.out_ + 1;
                          *pcVar10 = local_1e8.encoding_[iVar7];
                          *local_1e8.out_ = '\0';
                        }
                        uVar8 = (ulong)(iVar7 + 1U);
                        cVar9 = local_1e8.encoding_[(int)(iVar7 + 1U)];
                      }
                      if (cVar9 != '_') goto LAB_002d3599;
                      local_1e8.pos_ = iVar7 + 1;
                    }
                    goto switchD_002d2e70_default;
                  case kBeginGenericArgList:
                    bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"::<>");
                    if (bVar2) {
                      local_1e8.silence_depth_ = local_1e8.silence_depth_ + 1;
                      goto switchD_002d2e70_caseD_1b;
                    }
                    goto LAB_002d3599;
                  case kContinueGenericArgList:
switchD_002d2e70_caseD_1b:
                    if (local_1e8.encoding_[local_1e8.pos_] == 'E') {
LAB_002d30ee:
                      local_1e8.pos_ = local_1e8.pos_ + 1;
                      goto switchD_002d2e70_caseD_9;
                    }
                    lVar5 = (long)local_1e8.recursion_depth_;
                    if (lVar5 != 0x100) {
                      local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                      local_1e8.recursion_stack_[lVar5] = kContinueGenericArgList;
                      if (local_1e8.encoding_[local_1e8.pos_] != 'K') {
                        if (local_1e8.encoding_[local_1e8.pos_] != 'L') goto LAB_002d29bc;
LAB_002d3281:
                        bVar2 = anon_unknown_0::RustSymbolParser::ParseOptionalLifetime(&local_1e8);
                        goto LAB_002d322d;
                      }
                      local_1e8.pos_ = local_1e8.pos_ + 1;
LAB_002d3291:
                      while (local_1e8.encoding_[local_1e8.pos_] == 'B') {
                        local_1e8.pos_ = local_1e8.pos_ + 1;
                        bVar2 = anon_unknown_0::RustSymbolParser::BeginBackref(&local_1e8);
                        if (!bVar2) goto LAB_002d3599;
                        if (local_1e8.silence_depth_ != 0) goto switchD_002d2e70_caseD_1c;
                        lVar5 = (long)local_1e8.recursion_depth_;
                        if (lVar5 == 0x100) goto LAB_002d3599;
                        local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                        local_1e8.recursion_stack_[lVar5] = kConstantBackrefEnding;
                      }
                      if (local_1e8.encoding_[local_1e8.pos_] == 'p') {
                        local_1e8.pos_ = local_1e8.pos_ + 1;
                        pcVar10 = "_";
                        break;
                      }
                      local_1e8.silence_depth_ = local_1e8.silence_depth_ + 1;
                      lVar5 = (long)local_1e8.recursion_depth_;
                      if (lVar5 != 0x100) {
                        local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
                        local_1e8.recursion_stack_[lVar5] = kConstData;
                        goto LAB_002d29bc;
                      }
                    }
                    goto LAB_002d3599;
                  case kPathBackrefEnding:
                  case kTypeBackrefEnding:
                  case kConstantBackrefEnding:
switchD_002d2e70_caseD_1c:
                    lVar5 = (long)local_1e8.position_depth_;
                    local_1e8.position_depth_ = local_1e8.position_depth_ + -1;
                    local_1e8.pos_ = local_1e8.position_stack_[lVar5 + -1];
                  default:
                    goto switchD_002d2e70_default;
                  }
                  goto LAB_002d3228;
                }
                goto LAB_002d359c;
              }
              goto LAB_002d3599;
            }
            bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"<");
            bVar3 = 0;
            if (!bVar2) goto LAB_002d359c;
            RVar6 = kTraitImplType;
          }
          bVar3 = 0;
          if (local_1e8.recursion_depth_ == 0x100) goto LAB_002d359c;
          lVar5 = (long)local_1e8.recursion_depth_;
          local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
          local_1e8.recursion_stack_[lVar5] = RVar6;
          local_1e8.silence_depth_ = local_1e8.silence_depth_ + 1;
          bVar2 = anon_unknown_0::RustSymbolParser::ParseDisambiguator(&local_1e8,&local_34);
          if ((!bVar2) || (lVar5 = (long)local_1e8.recursion_depth_, lVar5 == 0x100))
          goto LAB_002d3599;
          local_1e8.recursion_depth_ = local_1e8.recursion_depth_ + 1;
          local_1e8.recursion_stack_[lVar5] = kImplPathEnding;
        }
      }
switchD_002d29f0_caseD_43:
      iVar7 = local_1e8.pos_;
      goto LAB_002d27dd;
    }
  }
  else {
LAB_002d3599:
    bVar3 = 0;
  }
LAB_002d359c:
  return (bool)(bVar3 & 1);
LAB_002d2b71:
  local_1e8.pos_ = local_1e8.pos_ + 1;
  bVar3 = local_1e8.encoding_[lVar5] + 0x9f;
  if ((0x19 < bVar3) || ((0x3bcfbbfU >> (bVar3 & 0x1f) & 1) == 0)) goto LAB_002d3599;
  pcVar10 = &DAT_00560a68 + *(int *)(&DAT_00560a68 + (ulong)bVar3 * 4);
LAB_002d3228:
  bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,pcVar10);
LAB_002d322d:
  if (bVar2 == false) goto LAB_002d3599;
  goto switchD_002d2e70_default;
switchD_002d2e70_caseD_3:
  bVar2 = anon_unknown_0::RustSymbolParser::Emit(&local_1e8,"::");
  if (!bVar2) goto LAB_002d3599;
  goto LAB_002d282e;
}

Assistant:

bool DemangleRustSymbolEncoding(const char* mangled, char* out,
                                size_t out_size) {
  return RustSymbolParser(mangled, out, out + out_size).Parse();
}